

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# literal.cpp
# Opt level: O2

Literal * __thiscall
wasm::Literal::shrS(Literal *__return_storage_ptr__,Literal *this,Literal *other)

{
  int iVar1;
  long lVar2;
  BasicType BVar3;
  Index IVar4;
  uintptr_t uVar5;
  
  BVar3 = wasm::Type::getBasic(&this->type);
  if (BVar3 == i64) {
    lVar2 = (this->field_0).i64;
    uVar5 = 3;
    IVar4 = Bits::getEffectiveShifts((other->field_0).i32,(Type)0x3);
    (__return_storage_ptr__->field_0).i64 = lVar2 >> ((byte)IVar4 & 0x3f);
  }
  else {
    if (BVar3 != i32) {
      handle_unreachable("unexpected type",
                         "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/literal.cpp"
                         ,0x57a);
    }
    iVar1 = (this->field_0).i32;
    uVar5 = 2;
    IVar4 = Bits::getEffectiveShifts((other->field_0).i32,(Type)0x2);
    (__return_storage_ptr__->field_0).i32 = iVar1 >> ((byte)IVar4 & 0x1f);
  }
  (__return_storage_ptr__->type).id = uVar5;
  return __return_storage_ptr__;
}

Assistant:

Literal Literal::shrS(const Literal& other) const {
  switch (type.getBasic()) {
    case Type::i32:
      return Literal(i32 >> Bits::getEffectiveShifts(other.i32, Type::i32));
    case Type::i64:
      return Literal(i64 >> Bits::getEffectiveShifts(other.i64, Type::i64));
    default:
      WASM_UNREACHABLE("unexpected type");
  }
}